

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O0

void flatbuffers::tests::Offset64Evolution(void)

{
  allocator<unsigned_char> *this;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  return_type rVar1;
  return_type rVar2;
  Offset<v1::RootTable> root;
  Offset<v2::RootTable> OVar3;
  size_t sVar4;
  uint8_t *puVar5;
  RootTable *pRVar6;
  Vector<unsigned_char,_unsigned_int> *pVVar7;
  Vector<unsigned_char,_unsigned_int> *pVVar8;
  Vector64<uint8_t> *pVVar9;
  RootTable *pRVar10;
  unsigned_long uVar11;
  size_type_conflict sVar12;
  reference pvVar13;
  float fVar14;
  float fVar15;
  RootTable *v2_root_2;
  RootTable *v1_root_2;
  undefined1 local_240 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> giant_data;
  FlatBufferBuilder64 builder_2;
  RootTable *v2_root_1;
  RootTable *v1_root_1;
  undefined1 local_190 [8];
  FlatBufferBuilder64 builder_1;
  RootTable *v2_root;
  RootTable *v1_root;
  undefined1 local_f8 [8];
  FlatBufferBuilder builder;
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> big_data;
  allocator<unsigned_char> local_35;
  uchar local_34 [4];
  iterator local_30;
  size_type_conflict local_28;
  undefined1 local_20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  
  builtin_memcpy(local_34,"\x01\x02\x03\x04",4);
  local_30 = local_34;
  local_28 = 4;
  std::allocator<unsigned_char>::allocator(&local_35);
  __l_00._M_len = local_28;
  __l_00._M_array = local_30;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20,__l_00,&local_35);
  std::allocator<unsigned_char>::~allocator(&local_35);
  builder.string_pool._3_1_ = 6;
  builder.string_pool._4_1_ = 7;
  builder.string_pool._5_1_ = 8;
  builder.string_pool._6_1_ = 9;
  builder.string_pool._7_1_ = 10;
  this = (allocator<unsigned_char> *)((long)&builder.string_pool + 2);
  std::allocator<unsigned_char>::allocator(this);
  __l._M_len = 5;
  __l._M_array = (iterator)((long)&builder.string_pool + 3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,__l,this);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&builder.string_pool + 2));
  sVar4 = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)local_f8,0x400,(Allocator *)0x0,false,sVar4);
  root = v1::CreateRootTableDirect
                   ((FlatBufferBuilder *)local_f8,1234.0,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  FlatBufferBuilderImpl<false>::Finish<v1::RootTable>
            ((FlatBufferBuilderImpl<false> *)local_f8,root,(char *)0x0);
  puVar5 = FlatBufferBuilderImpl<false>::GetBufferPointer((FlatBufferBuilderImpl<false> *)local_f8);
  pRVar6 = v1::GetRootTable(puVar5);
  puVar5 = FlatBufferBuilderImpl<false>::GetBufferPointer((FlatBufferBuilderImpl<false> *)local_f8);
  builder_1.string_pool = (StringOffsetMap *)v2::GetRootTable(puVar5);
  fVar14 = v1::RootTable::a(pRVar6);
  fVar15 = v2::RootTable::a((RootTable *)builder_1.string_pool);
  TestEq<float,float>(fVar14,fVar15,"\'v1_root->a()\' != \'v2_root->a()\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                      ,0xe2,"");
  pVVar7 = v1::RootTable::b(pRVar6);
  pVVar8 = v2::RootTable::b((RootTable *)builder_1.string_pool);
  TestEq<flatbuffers::Vector<unsigned_char,unsigned_int>const*,flatbuffers::Vector<unsigned_char,unsigned_int>const*>
            (pVVar7,pVVar8,"\'v1_root->b()\' != \'v2_root->b()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xe4,"");
  pVVar7 = v1::RootTable::b(pRVar6);
  rVar1 = Vector<unsigned_char,_unsigned_int>::Get(pVVar7,2);
  TestEq<unsigned_char,int>
            (rVar1,3,"\'v1_root->b()->Get(2)\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xe5,"");
  pVVar7 = v2::RootTable::b((RootTable *)builder_1.string_pool);
  rVar1 = Vector<unsigned_char,_unsigned_int>::Get(pVVar7,2);
  TestEq<unsigned_char,int>
            (rVar1,3,"\'v2_root->b()->Get(2)\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xe6,"");
  pVVar9 = v2::RootTable::big_vector((RootTable *)builder_1.string_pool);
  TestEq<bool,bool>(true,pVVar9 == (Vector64<uint8_t> *)0x0,
                    "\'true\' != \'v2_root->big_vector() == nullptr\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0xea,"");
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl((FlatBufferBuilderImpl<false> *)local_f8);
  sVar4 = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<true>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<true> *)local_190,0x400,(Allocator *)0x0,false,sVar4);
  OVar3 = v2::CreateRootTableDirect
                    ((FlatBufferBuilder64 *)local_190,1234.0,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  FlatBufferBuilderImpl<true>::Finish<v2::RootTable>
            ((FlatBufferBuilderImpl<true> *)local_190,OVar3,(char *)0x0);
  puVar5 = FlatBufferBuilderImpl<true>::GetBufferPointer((FlatBufferBuilderImpl<true> *)local_190);
  pRVar6 = v1::GetRootTable(puVar5);
  puVar5 = FlatBufferBuilderImpl<true>::GetBufferPointer((FlatBufferBuilderImpl<true> *)local_190);
  pRVar10 = v2::GetRootTable(puVar5);
  fVar14 = v1::RootTable::a(pRVar6);
  fVar15 = v2::RootTable::a(pRVar10);
  TestEq<float,float>(fVar14,fVar15,"\'v1_root->a()\' != \'v2_root->a()\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                      ,0xf9,"");
  pVVar7 = v1::RootTable::b(pRVar6);
  pVVar8 = v2::RootTable::b(pRVar10);
  TestEq<flatbuffers::Vector<unsigned_char,unsigned_int>const*,flatbuffers::Vector<unsigned_char,unsigned_int>const*>
            (pVVar7,pVVar8,"\'v1_root->b()\' != \'v2_root->b()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xfb,"");
  pVVar7 = v1::RootTable::b(pRVar6);
  rVar1 = Vector<unsigned_char,_unsigned_int>::Get(pVVar7,2);
  TestEq<unsigned_char,int>
            (rVar1,3,"\'v1_root->b()->Get(2)\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xfc,"");
  pVVar7 = v2::RootTable::b(pRVar10);
  rVar1 = Vector<unsigned_char,_unsigned_int>::Get(pVVar7,2);
  TestEq<unsigned_char,int>
            (rVar1,3,"\'v2_root->b()->Get(2)\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xfd,"");
  pVVar9 = v2::RootTable::big_vector(pRVar10);
  TestEq<bool,bool>(true,pVVar9 != (Vector64<uint8_t> *)0x0,
                    "\'true\' != \'v2_root->big_vector() != nullptr\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0x101,"");
  pVVar9 = v2::RootTable::big_vector(pRVar10);
  uVar11 = Vector<unsigned_char,_unsigned_long>::size(pVVar9);
  sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  TestEq<unsigned_long,unsigned_long>
            (uVar11,sVar12,"\'v2_root->big_vector()->size()\' != \'big_data.size()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x102,"");
  pVVar9 = v2::RootTable::big_vector(pRVar10);
  rVar2 = Vector<unsigned_char,_unsigned_long>::Get(pVVar9,2);
  TestEq<unsigned_char,int>
            (rVar2,8,"\'v2_root->big_vector()->Get(2)\' != \'8\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x103,"");
  FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl((FlatBufferBuilderImpl<true> *)local_190);
  sVar4 = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<true>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<true> *)
             &giant_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0x400,(Allocator *)0x0,false,sVar4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240,8);
  pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240,2);
  *pvVar13 = '*';
  OVar3 = v2::CreateRootTableDirect
                    ((FlatBufferBuilder64 *)
                     &giant_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,1234.0,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
  FlatBufferBuilderImpl<true>::Finish<v2::RootTable>
            ((FlatBufferBuilderImpl<true> *)
             &giant_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,OVar3,(char *)0x0);
  puVar5 = FlatBufferBuilderImpl<true>::GetBufferPointer
                     ((FlatBufferBuilderImpl<true> *)
                      &giant_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  pRVar6 = v1::GetRootTable(puVar5);
  puVar5 = FlatBufferBuilderImpl<true>::GetBufferPointer
                     ((FlatBufferBuilderImpl<true> *)
                      &giant_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  pRVar10 = v2::GetRootTable(puVar5);
  fVar14 = v1::RootTable::a(pRVar6);
  fVar15 = v2::RootTable::a(pRVar10);
  TestEq<float,float>(fVar14,fVar15,"\'v1_root->a()\' != \'v2_root->a()\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                      ,0x118,"");
  pVVar7 = v1::RootTable::b(pRVar6);
  pVVar8 = v2::RootTable::b(pRVar10);
  TestEq<flatbuffers::Vector<unsigned_char,unsigned_int>const*,flatbuffers::Vector<unsigned_char,unsigned_int>const*>
            (pVVar7,pVVar8,"\'v1_root->b()\' != \'v2_root->b()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x11a,"");
  pVVar7 = v1::RootTable::b(pRVar6);
  rVar1 = Vector<unsigned_char,_unsigned_int>::Get(pVVar7,2);
  TestEq<unsigned_char,int>
            (rVar1,3,"\'v1_root->b()->Get(2)\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x11b,"");
  pVVar7 = v2::RootTable::b(pRVar10);
  rVar1 = Vector<unsigned_char,_unsigned_int>::Get(pVVar7,2);
  TestEq<unsigned_char,int>
            (rVar1,3,"\'v2_root->b()->Get(2)\' != \'3\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x11c,"");
  pVVar9 = v2::RootTable::big_vector(pRVar10);
  TestEq<bool,bool>(true,pVVar9 != (Vector64<uint8_t> *)0x0,
                    "\'true\' != \'v2_root->big_vector() != nullptr\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0x120,"");
  pVVar9 = v2::RootTable::big_vector(pRVar10);
  uVar11 = Vector<unsigned_char,_unsigned_long>::size(pVVar9);
  sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
  TestEq<unsigned_long,unsigned_long>
            (uVar11,sVar12,"\'v2_root->big_vector()->size()\' != \'giant_data.size()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x121,"");
  pVVar9 = v2::RootTable::big_vector(pRVar10);
  rVar2 = Vector<unsigned_char,_unsigned_long>::Get(pVVar9,2);
  TestEq<unsigned_char,int>
            (rVar2,0x2a,"\'v2_root->big_vector()->Get(2)\' != \'42\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x122,"");
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
  FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<true> *)
             &giant_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  return;
}

Assistant:

void Offset64Evolution() {
  // Some common data for the tests.
  const std::vector<uint8_t> data = { 1, 2, 3, 4 };
  const std::vector<uint8_t> big_data = { 6, 7, 8, 9, 10 };

  // Built V1 read V2
  {
    // Use the 32-bit builder since V1 doesn't have any 64-bit offsets.
    FlatBufferBuilder builder;

    builder.Finish(v1::CreateRootTableDirect(builder, 1234, &data));

    // Use each version to get a view at the root table.
    auto v1_root = v1::GetRootTable(builder.GetBufferPointer());
    auto v2_root = v2::GetRootTable(builder.GetBufferPointer());

    // Test field equivalents for fields common to V1 and V2.
    TEST_EQ(v1_root->a(), v2_root->a());

    TEST_EQ(v1_root->b(), v2_root->b());
    TEST_EQ(v1_root->b()->Get(2), 3);
    TEST_EQ(v2_root->b()->Get(2), 3);

    // This field is added in V2, so it should be null since V1 couldn't have
    // written it.
    TEST_ASSERT(v2_root->big_vector() == nullptr);
  }

  // Built V2 read V1
  {
    // Use the 64-bit builder since V2 has 64-bit offsets.
    FlatBufferBuilder64 builder;

    builder.Finish(v2::CreateRootTableDirect(builder, 1234, &data, &big_data));

    // Use each version to get a view at the root table.
    auto v1_root = v1::GetRootTable(builder.GetBufferPointer());
    auto v2_root = v2::GetRootTable(builder.GetBufferPointer());

    // Test field equivalents for fields common to V1 and V2.
    TEST_EQ(v1_root->a(), v2_root->a());

    TEST_EQ(v1_root->b(), v2_root->b());
    TEST_EQ(v1_root->b()->Get(2), 3);
    TEST_EQ(v2_root->b()->Get(2), 3);

    // Test that V2 can read the big vector, which V1 doesn't even have
    // accessors for (i.e. v1_root->big_vector() doesn't exist).
    TEST_ASSERT(v2_root->big_vector() != nullptr);
    TEST_EQ(v2_root->big_vector()->size(), big_data.size());
    TEST_EQ(v2_root->big_vector()->Get(2), 8);
  }

  // Built V2 read V1, bigger than max 32-bit buffer sized.
  // This checks that even a large buffer can still be read by V1.
  {
    // Use the 64-bit builder since V2 has 64-bit offsets.
    FlatBufferBuilder64 builder;

    std::vector<uint8_t> giant_data;
    giant_data.resize(1LL << 3);
    giant_data[2] = 42;

    builder.Finish(
        v2::CreateRootTableDirect(builder, 1234, &data, &giant_data));

    // Use each version to get a view at the root table.
    auto v1_root = v1::GetRootTable(builder.GetBufferPointer());
    auto v2_root = v2::GetRootTable(builder.GetBufferPointer());

    // Test field equivalents for fields common to V1 and V2.
    TEST_EQ(v1_root->a(), v2_root->a());

    TEST_EQ(v1_root->b(), v2_root->b());
    TEST_EQ(v1_root->b()->Get(2), 3);
    TEST_EQ(v2_root->b()->Get(2), 3);

    // Test that V2 can read the big vector, which V1 doesn't even have
    // accessors for (i.e. v1_root->big_vector() doesn't exist).
    TEST_ASSERT(v2_root->big_vector() != nullptr);
    TEST_EQ(v2_root->big_vector()->size(), giant_data.size());
    TEST_EQ(v2_root->big_vector()->Get(2), 42);
  }
}